

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_ml_literal_string<toml::type_config>
          (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  size_type sVar2;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  string_type val;
  string str;
  region reg;
  string_format_info fmt;
  spec *spec;
  location first;
  region *in_stack_fffffffffffffa88;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  location *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  location *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffab8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  region *in_stack_fffffffffffffae8;
  error_info *v;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *com;
  string_type *in_stack_fffffffffffffb00;
  basic_value<toml::type_config> *in_stack_fffffffffffffb08;
  string_format_info in_stack_fffffffffffffb16;
  basic_value<toml::type_config> *v_00;
  undefined6 in_stack_fffffffffffffb80;
  undefined2 in_stack_fffffffffffffb86;
  sequence *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffce0;
  location *in_stack_fffffffffffffce8;
  sequence *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined4 local_270;
  allocator<char> local_269 [144];
  error_info local_1d9 [4];
  string_format_info local_6a;
  spec *local_68;
  context<toml::type_config> *local_18;
  
  com = in_RDI;
  local_18 = in_RDX;
  location::location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  string_format_info::string_format_info(&local_6a);
  local_6a.fmt = multiline_literal;
  syntax::ml_literal_string((spec *)in_stack_fffffffffffffc18);
  sequence::scan(in_stack_fffffffffffffb88,
                 (location *)CONCAT26(in_stack_fffffffffffffb86,in_stack_fffffffffffffb80));
  sequence::~sequence((sequence *)in_stack_fffffffffffffa90);
  bVar1 = region::is_ok((region *)0x684fcb);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffffae8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
               (size_type)in_stack_fffffffffffffa90);
    this_01 = &local_290;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (this_01);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
               (size_type)in_stack_fffffffffffffa90);
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(&local_290);
    if ((sVar2 == 0) ||
       (in_stack_fffffffffffffac8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98),
       *(char *)&(in_stack_fffffffffffffac8->_M_dataplus)._M_p != '\n')) {
      sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(&local_290);
      if ((1 < sVar2) &&
         ((in_stack_fffffffffffffac0._M_current =
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98),
          (allocator<char>)*in_stack_fffffffffffffac0._M_current == (allocator<char>)0xd &&
          (in_stack_fffffffffffffab8._M_current =
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98),
          *in_stack_fffffffffffffab8._M_current == '\n')))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
                   (size_type)in_stack_fffffffffffffa90);
        local_6a.start_with_newline = true;
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
                 (size_type)in_stack_fffffffffffffa90);
      local_6a.start_with_newline = true;
    }
    __a = &local_290;
    local_2c1._9_8_ =
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffa88);
    local_2c1._1_8_ =
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (in_stack_fffffffffffffa98);
    this_00 = &local_2c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_00,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(allocator<char> *)__a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    in_stack_fffffffffffffa90 =
         (result<toml::basic_value<toml::type_config>,_toml::error_info> *)&stack0xfffffffffffffb88;
    std::__cxx11::string::string(this_01,in_stack_fffffffffffffac8);
    v_00 = (basic_value<toml::type_config> *)0x0;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x68548e);
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffffb00;
    region::region((region *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    basic_value<toml::type_config>::basic_value
              (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffb16,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)com,(region_type *)in_RDI);
    ok<toml::basic_value<toml::type_config>>(v_00);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffa90,(success_type *)in_stack_fffffffffffffa88);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x685503);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffa90);
    region::~region((region *)in_stack_fffffffffffffa90);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa90);
    local_270 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa90);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa90);
  }
  else {
    v = local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
               (allocator<char> *)in_stack_fffffffffffffac0._M_current);
    syntax::ml_literal_string((spec *)in_stack_fffffffffffffc18);
    location::location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
               (allocator<char> *)in_stack_fffffffffffffac0._M_current);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               in_stack_fffffffffffffce0);
    err<toml::error_info>(v);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffa90,(failure_type *)in_stack_fffffffffffffa88);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6850c2);
    error_info::~error_info((error_info *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa90);
    std::allocator<char>::~allocator(local_269);
    location::~location((location *)in_stack_fffffffffffffa90);
    sequence::~sequence((sequence *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa90);
    std::allocator<char>::~allocator((allocator<char> *)local_1d9);
    local_270 = 1;
  }
  region::~region((region *)in_stack_fffffffffffffa90);
  location::~location((location *)in_stack_fffffffffffffa90);
  return com;
}

Assistant:

result<basic_value<TC>, error_info>
parse_ml_literal_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    string_format_info fmt;
    fmt.fmt = string_format::multiline_literal;

    auto reg = syntax::ml_literal_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_ml_literal_string: "
            "invalid string format",
            syntax::ml_literal_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.substr(0, 3) == "'''");
    assert(str.substr(str.size()-3, 3) == "'''");
    str.erase(0, 3);
    str.erase(str.size()-3, 3);

    // the first newline just after """ is trimmed
    if(str.size() >= 1 && str.at(0) == '\n')
    {
        str.erase(0, 1);
        fmt.start_with_newline = true;
    }
    else if(str.size() >= 2 && str.at(0) == '\r' && str.at(1) == '\n')
    {
        str.erase(0, 2);
        fmt.start_with_newline = true;
    }

    using string_type = typename basic_value<TC>::string_type;
    string_type val(str.begin(), str.end());

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}